

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O0

void __thiscall muduo::Thread::Thread(Thread *this,ThreadFunc *func,string *n)

{
  string *in_RDX;
  Thread *in_RSI;
  undefined1 *in_RDI;
  function<void_()> *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffdc;
  CountDownLatch *in_stack_ffffffffffffffe0;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  std::function<void_()>::function((function<void_()> *)(in_RDI + 0x18),in_stack_ffffffffffffffb8);
  std::__cxx11::string::string((string *)(in_RDI + 0x38),in_RDX);
  CountDownLatch::CountDownLatch(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  setDefaultName(in_RSI);
  return;
}

Assistant:

Thread::Thread(ThreadFunc func, const string& n)
  : started_(false),
    joined_(false),
    pthreadId_(0),
    tid_(0),
    func_(std::move(func)),
    name_(n),
    latch_(1)
{
  setDefaultName();
}